

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * create_reference(cJSON *item)

{
  cJSON *ref;
  cJSON *item_local;
  
  item_local = cJSON_New_Item();
  if (item_local == (cJSON *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    memcpy(item_local,item,0x40);
    item_local->string = (char *)0x0;
    item_local->type = item_local->type | 0x100;
    item_local->prev = (cJSON *)0x0;
    item_local->next = (cJSON *)0x0;
  }
  return item_local;
}

Assistant:

static cJSON *
create_reference(cJSON *item)
{
    cJSON *ref = cJSON_New_Item();
    if (!ref)
        return 0;
    memcpy(ref, item, sizeof(cJSON));
    ref->string = 0;
    ref->type |= cJSON_IsReference;
    ref->next = ref->prev = 0;
    return ref;
}